

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::TestExceptionCallback::logMessage
          (TestExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  ProcessContext *pPVar1;
  size_t sVar2;
  String *params_4;
  char **params_1;
  String *params_3;
  Repeat<char> RVar3;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> trace_00;
  String *in_stack_fffffffffffffd80;
  StringPtr local_248;
  void **local_238;
  void **ppvStack_230;
  String local_220;
  kj *local_208;
  void **ppvStack_200;
  String local_1f0;
  String local_1d8;
  StringPtr local_1c0;
  undefined1 local_1aa;
  char local_1a9;
  undefined1 local_1a8 [56];
  String local_170;
  kj *local_158;
  void **local_150;
  undefined1 auStack_148 [8];
  ArrayPtr<void_*const> trace;
  void *traceSpace [32];
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  undefined8 uStack_10;
  LogSeverity severity_local;
  TestExceptionCallback *this_local;
  
  text_local._0_4_ = contextDepth;
  text_local._4_4_ = line;
  _contextDepth_local = file;
  file_local._4_4_ = severity;
  uStack_10 = this;
  memset(&trace.size_,0,0x100);
  ArrayPtr<void*>::ArrayPtr<32ul>((ArrayPtr<void*> *)&local_158,(void *(*) [32])&trace.size_);
  space.size_ = 2;
  space.ptr = local_150;
  _auStack_148 = getStackTrace(local_158,space,line);
  sVar2 = String::size(text);
  if (sVar2 == 0) {
    heapString(&local_170,"expectation failed");
    String::operator=(text,&local_170);
    String::~String(&local_170);
  }
  local_1a9 = '_';
  RVar3 = repeat<char>(&local_1a9,(long)(int)text_local);
  local_1a8._8_8_ = RVar3.count;
  local_1a8[0] = RVar3.value;
  local_1aa = 0x3a;
  params_4 = mv<kj::String>(text);
  params_3 = (String *)0x95a84a;
  params_1 = (char **)&local_1aa;
  str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
            ((String *)(local_1a8 + 0x10),(kj *)local_1a8,(Repeat<char> *)&contextDepth_local,
             params_1,(char *)((long)&text_local + 4),(int *)0x95a84a,(char (*) [3])params_4,
             in_stack_fffffffffffffd80);
  String::operator=(text,(String *)(local_1a8 + 0x10));
  String::~String((String *)(local_1a8 + 0x10));
  if ((file_local._4_4_ == ERROR) || (file_local._4_4_ == FATAL)) {
    fail(this);
    pPVar1 = this->context;
    local_208 = (kj *)auStack_148;
    ppvStack_200 = trace.ptr;
    trace_00.size_ = (size_t)params_1;
    trace_00.ptr = trace.ptr;
    stringifyStackTraceAddresses(&local_1f0,(kj *)auStack_148,trace_00);
    local_238 = (void **)auStack_148;
    ppvStack_230 = trace.ptr;
    stringifyStackTrace(&local_220,_auStack_148);
    str<kj::String&,char_const(&)[9],kj::String,kj::String>
              (&local_1d8,(kj *)text,(String *)0x96e454,(char (*) [9])&local_1f0,&local_220,params_3
              );
    StringPtr::StringPtr(&local_1c0,&local_1d8);
    (*pPVar1->_vptr_ProcessContext[3])(pPVar1,local_1c0.content.ptr,local_1c0.content.size_);
    String::~String(&local_1d8);
    String::~String(&local_220);
    String::~String(&local_1f0);
  }
  else {
    pPVar1 = this->context;
    StringPtr::StringPtr(&local_248,text);
    (*pPVar1->_vptr_ProcessContext[2])(pPVar1,local_248.content.ptr,local_248.content.size_);
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    void* traceSpace[32]{};
    auto trace = getStackTrace(traceSpace, 2);

    if (text.size() == 0) {
      text = kj::heapString("expectation failed");
    }

    text = kj::str(kj::repeat('_', contextDepth), file, ':', line, ": ", kj::mv(text));

    if (severity == LogSeverity::ERROR || severity == LogSeverity::FATAL) {
      fail();
      context.error(kj::str(text, "\nstack: ", stringifyStackTraceAddresses(trace), stringifyStackTrace(trace)));
    } else {
      context.warning(text);
    }
  }